

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readScatteringRadius.hpp
# Opt level: O2

optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> * __thiscall
njoy::ENDFtk::section::Type<2,151>::Isotope::
readScatteringRadius<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> *__return_storage_ptr__,
          Isotope *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int NRO)

{
  undefined8 *puVar1;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  TabulationRecord local_b0;
  
  if (MT == 1) {
    ScatteringRadius::ScatteringRadius<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ScatteringRadius *)&local_b0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    std::optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>::
    optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true>
              (__return_storage_ptr__,(ScatteringRadius *)&local_b0);
    TabulationRecord::~TabulationRecord(&local_b0);
  }
  else {
    if (MT != 0) {
      tools::Log::error<char_const*>
                ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      tools::Log::info<char_const*>
                ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      tools::Log::info<char_const*,int>("NRO value: {}",MT);
      tools::Log::info<char_const*,long>("Line number: {}",(long)end->_M_current);
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getenv;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    }
    (__return_storage_ptr__->
    super__Optional_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_false,_false>).
    _M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius,_true,_false,_false>
    .super__Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>._M_engaged
         = false;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::optional< ScatteringRadius >
readScatteringRadius( Iterator& begin,
                      const Iterator& end,
                      long& lineNumber,
                      int MAT,
                      int MF,
                      int MT,
                      int NRO ) {

  switch ( NRO ) {

    // no energy dependent scattering radius
    case 0 : return std::nullopt;
    // energy dependent scattering radius
    case 1 : return ScatteringRadius( begin, end, lineNumber, MAT, MF, MT );
    default : {

      Log::error( "Encountered illegal NRO value" );
      Log::info( "NRO is either 0 (no energy dependent scattering radius "
                 "given) or 1 (an energy dependent scattering radius is "
                 "given)" );
      Log::info( "NRO value: {}", NRO );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}